

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O3

void secp256k1_musig_keyaggcoef_internal
               (secp256k1_scalar *r,uchar *pks_hash,secp256k1_ge *pk,secp256k1_ge *second_pk)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uchar buf [33];
  size_t local_d0;
  uchar local_c8 [48];
  secp256k1_sha256 local_98;
  
  if ((second_pk->infinity == 0) && (pk->infinity == 0)) {
    uVar1 = (pk->x).n[4];
    uVar3 = (uVar1 >> 0x30) * 0x1000003d1 + (pk->x).n[0];
    uVar4 = (uVar3 >> 0x34) + (pk->x).n[1];
    uVar5 = (uVar4 >> 0x34) + (pk->x).n[2];
    uVar6 = (uVar5 >> 0x34) + (pk->x).n[3];
    local_98.s._0_8_ = ((second_pk->x).n[0] - (uVar3 & 0xfffffffffffff)) + 0x3ffffbfffff0bc;
    local_98.s._8_8_ = ((second_pk->x).n[1] - (uVar4 & 0xfffffffffffff)) + 0x3ffffffffffffc;
    local_98.s._16_8_ = ((second_pk->x).n[2] - (uVar5 & 0xfffffffffffff)) + 0x3ffffffffffffc;
    local_98.s._24_8_ = ((second_pk->x).n[3] - (uVar6 & 0xfffffffffffff)) + 0x3ffffffffffffc;
    local_98.buf._0_8_ =
         ((second_pk->x).n[4] - ((uVar6 >> 0x34) + (uVar1 & 0xffffffffffff))) + 0x3fffffffffffc;
    iVar2 = secp256k1_fe_impl_normalizes_to_zero((secp256k1_fe *)&local_98);
    if (iVar2 != 0) {
      uVar1 = (pk->y).n[4];
      uVar3 = (uVar1 >> 0x30) * 0x1000003d1 + (pk->y).n[0];
      uVar4 = (uVar3 >> 0x34) + (pk->y).n[1];
      uVar5 = (uVar4 >> 0x34) + (pk->y).n[2];
      uVar6 = (uVar5 >> 0x34) + (pk->y).n[3];
      local_98.s._0_8_ = ((second_pk->y).n[0] - (uVar3 & 0xfffffffffffff)) + 0x3ffffbfffff0bc;
      local_98.s._8_8_ = ((second_pk->y).n[1] - (uVar4 & 0xfffffffffffff)) + 0x3ffffffffffffc;
      local_98.s._16_8_ = ((second_pk->y).n[2] - (uVar5 & 0xfffffffffffff)) + 0x3ffffffffffffc;
      local_98.s._24_8_ = ((second_pk->y).n[3] - (uVar6 & 0xfffffffffffff)) + 0x3ffffffffffffc;
      local_98.buf._0_8_ =
           ((second_pk->y).n[4] - ((uVar6 >> 0x34) + (uVar1 & 0xffffffffffff))) + 0x3fffffffffffc;
      iVar2 = secp256k1_fe_impl_normalizes_to_zero((secp256k1_fe *)&local_98);
      if (iVar2 != 0) {
        r->d[0] = 1;
        r->d[1] = 0;
        r->d[2] = 0;
        r->d[3] = 0;
        return;
      }
    }
  }
  local_98.s[0] = 0x6ef02c5a;
  local_98.s[1] = 0x6a480de;
  local_98.s[2] = 0x1f298665;
  local_98.s[3] = 0x1d1134f2;
  local_98.s[4] = 0x56a0b063;
  local_98.s[5] = 0x52da4147;
  local_98.s[6] = 0xf280d9d4;
  local_98.s[7] = 0x4484be15;
  local_98.bytes = 0x40;
  secp256k1_sha256_write(&local_98,pks_hash,0x20);
  secp256k1_eckey_pubkey_serialize(pk,local_c8,&local_d0,1);
  secp256k1_sha256_write(&local_98,local_c8,0x21);
  secp256k1_sha256_finalize(&local_98,local_c8);
  secp256k1_scalar_set_b32(r,local_c8,(int *)0x0);
  return;
}

Assistant:

static void secp256k1_musig_keyaggcoef_internal(secp256k1_scalar *r, const unsigned char *pks_hash, secp256k1_ge *pk, const secp256k1_ge *second_pk) {
    VERIFY_CHECK(!secp256k1_ge_is_infinity(pk));

    if (!secp256k1_ge_is_infinity(second_pk)
          && secp256k1_ge_eq_var(pk, second_pk)) {
        secp256k1_scalar_set_int(r, 1);
    } else {
        secp256k1_sha256 sha;
        unsigned char buf[33];
        size_t buflen = sizeof(buf);
        int ret;
        secp256k1_musig_keyaggcoef_sha256(&sha);
        secp256k1_sha256_write(&sha, pks_hash, 32);
        ret = secp256k1_eckey_pubkey_serialize(pk, buf, &buflen, 1);
#ifdef VERIFY
        /* Serialization does not fail since the pk is not the point at infinity
         * (according to this function's precondition). */
        VERIFY_CHECK(ret && buflen == sizeof(buf));
#else
        (void) ret;
#endif
        secp256k1_sha256_write(&sha, buf, sizeof(buf));
        secp256k1_sha256_finalize(&sha, buf);
        secp256k1_scalar_set_b32(r, buf, NULL);
    }
}